

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O3

wchar_t curses_display_menu_core
                  (nh_menuitem_conflict *items,wchar_t icount,char *title,wchar_t how,
                  wchar_t *results,wchar_t x1,wchar_t y1,wchar_t x2,wchar_t y2,
                  _func_nh_bool_win_menu_ptr_wchar_t *changefn,nh_bool start_at_bottom)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  nh_bool nVar4;
  undefined4 uVar5;
  int iVar6;
  wchar_t wVar7;
  gamewin *gw;
  WINDOW *pWVar8;
  _func_void_gamewin_ptr *p_Var9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  char cVar15;
  uint uVar16;
  uint uVar17;
  wchar_t wVar18;
  code *pcVar19;
  wchar_t wVar20;
  ulong uVar21;
  char sbuf [256];
  int local_158;
  char local_138 [264];
  
  uVar5 = curs_set(0);
  gw = alloc_gamewin(L'\x98');
  gw->draw = draw_menu;
  gw->resize = resize_menu;
  gw[1].resize = (_func_void_gamewin_ptr *)items;
  *(wchar_t *)&gw[1].prev = icount;
  gw[1].next = (gamewin *)title;
  *(wchar_t *)((long)&gw[1].prev + 4) = how;
  pWVar8 = (WINDOW *)calloc((long)icount,1);
  gw[1].win = pWVar8;
  *(wchar_t *)((long)&gw[4].resize + 4) = x1;
  *(wchar_t *)&gw[4].win = y1;
  *(wchar_t *)((long)&gw[4].win + 4) = x2;
  *(wchar_t *)&gw[4].next = y2;
  if (x1 < L'\x01') {
    x1 = L'\0';
  }
  wVar7 = L'\0';
  if (L'\0' < y1) {
    wVar7 = y1;
  }
  if (x2 < L'\0') {
    x2 = _COLS;
  }
  if (y2 < L'\0') {
    y2 = _LINES;
  }
  uVar21 = (ulong)(uint)icount;
  if (L'\0' < icount) {
    cVar15 = 'a';
    lVar14 = 0;
    do {
      if ((((&items->accel)[lVar14] == '\0') && (*(int *)(items->caption + lVar14 + -4) == 1)) &&
         (*(int *)(items->caption + lVar14 + -8) != 0)) {
        (&items->accel)[lVar14] = cVar15;
        if (cVar15 == 'z') {
          cVar15 = 'A';
        }
        else if (cVar15 == 'Z') {
          cVar15 = 'a';
        }
        else {
          cVar15 = cVar15 + '\x01';
        }
      }
      lVar14 = lVar14 + 0x10c;
    } while (uVar21 * 0x10c - lVar14 != 0);
  }
  layout_menu(gw);
  if (start_at_bottom != '\0') {
    iVar6 = *(int *)&gw[1].prev - *(int *)((long)&gw[2].resize + 4);
    iVar13 = 0;
    if (0 < iVar6) {
      iVar13 = iVar6;
    }
    *(int *)&gw[2].draw = iVar13;
  }
  iVar13 = *(int *)((long)&gw[2].draw + 4);
  pWVar8 = (WINDOW *)
           newwin(iVar13,*(int *)&gw[2].win,((y2 - wVar7) - iVar13) / 2 + wVar7,
                  ((x2 - x1) - *(int *)&gw[2].win) / 2 + x1);
  gw->win = pWVar8;
  keypad(pWVar8,1);
  nh_box_wborder((WINDOW_conflict *)gw->win,0x600);
  p_Var9 = (_func_void_gamewin_ptr *)
           derwin(gw->win,*(undefined4 *)((long)&gw[2].resize + 4),
                  *(undefined4 *)((long)&gw[2].win + 4),*(int *)&gw[2].resize + -1,2);
  gw[1].draw = p_Var9;
  leaveok(gw->win,1);
  leaveok(gw[1].draw,1);
  local_158 = 0;
LAB_0010cc16:
  draw_menu(gw);
  wVar7 = nh_wgetch(gw->win);
  if (wVar7 < L'|') {
    if (wVar7 < L':') {
      if (wVar7 < L'-') {
        if (wVar7 != L' ') {
          if (wVar7 != L'\r') {
            if (wVar7 != L'\x1b') goto LAB_0010ce6b;
            local_158 = 1;
          }
          goto LAB_0010cf9c;
        }
LAB_0010cd55:
        uVar17 = *(uint *)&gw[2].draw;
        iVar13 = *(int *)((long)&gw[2].resize + 4);
        uVar12 = *(int *)&gw[1].prev - iVar13;
        uVar16 = iVar13 + uVar17;
        if ((int)uVar12 <= (int)uVar16) {
          uVar16 = uVar12;
        }
        *(uint *)&gw[2].draw = uVar16;
        uVar17 = uVar16 ^ uVar17 | wVar7 ^ 0x20U;
LAB_0010cd79:
        if (uVar17 == 0) {
          local_158 = 0;
LAB_0010cf9c:
          delwin(gw[1].draw);
          delwin(gw->win);
          pWVar8 = gw[1].win;
          if (icount < L'\x01' || (char)local_158 != '\0') {
            wVar7 = -local_158;
          }
          else {
            uVar11 = 0;
            wVar7 = L'\0';
            do {
              if (*(char *)((long)(pWVar8->_bkgrnd).chars + (uVar11 - 0x5c)) != '\0') {
                if (results != (wchar_t *)0x0) {
                  results[wVar7] = items->id;
                }
                wVar7 = wVar7 + L'\x01';
              }
              uVar11 = uVar11 + 1;
              items = items + 1;
            } while (uVar21 != uVar11);
          }
          free(pWVar8);
          delete_gamewin(gw);
          redraw_game_windows();
          curs_set(uVar5);
          return wVar7;
        }
      }
      else if (wVar7 == L'-') {
        if (L'\0' < icount) {
          uVar11 = 0;
          do {
            *(undefined1 *)((long)((gw[1].win)->_bkgrnd).chars + (uVar11 - 0x5c)) = 0;
            uVar11 = uVar11 + 1;
          } while (uVar21 != uVar11);
        }
      }
      else {
        if (wVar7 != L'.') goto LAB_0010ce6b;
        if (*(int *)((long)&gw[1].prev + 4) == 2 && L'\0' < icount) {
          lVar14 = 4;
          uVar11 = 0;
          do {
            if (*(int *)(gw[1].resize + lVar14) == 1) {
              *(undefined1 *)((long)((gw[1].win)->_bkgrnd).chars + (uVar11 - 0x5c)) = 1;
            }
            uVar11 = uVar11 + 1;
            lVar14 = lVar14 + 0x10c;
          } while (uVar21 != uVar11);
        }
      }
      goto LAB_0010cc16;
    }
    if (wVar7 < L'>') {
      if (wVar7 != L':') {
        if (wVar7 == L'<') {
LAB_0010cd15:
          iVar13 = *(int *)&gw[2].draw;
LAB_0010cd99:
          iVar13 = iVar13 - *(int *)((long)&gw[2].resize + 4);
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          goto LAB_0010cda8;
        }
        goto LAB_0010ce6b;
      }
      curses_getline("Search:",local_138);
      if (L'\0' < icount) {
        pcVar19 = gw[1].resize + 8;
        uVar11 = 0;
        do {
          pcVar10 = strstr((char *)pcVar19,local_138);
          if (pcVar10 != (char *)0x0) {
            iVar13 = *(int *)&gw[1].prev - *(int *)((long)&gw[2].resize + 4);
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            if ((int)uVar11 < iVar13) {
              iVar13 = (int)uVar11;
            }
            goto LAB_0010cda8;
          }
          uVar11 = uVar11 + 1;
          pcVar19 = pcVar19 + 0x10c;
        } while (uVar21 != uVar11);
      }
      goto LAB_0010cc16;
    }
    if (wVar7 == L'>') goto LAB_0010cd55;
    iVar13 = 0;
    if (wVar7 == L'^') goto LAB_0010cda8;
  }
  else {
    if (wVar7 < L'Œ') {
      if (wVar7 < L'ă') {
        if (wVar7 == L'|') goto LAB_0010cd94;
        if (wVar7 != L'Ă') goto LAB_0010ce6b;
        if (*(int *)&gw[1].prev - *(int *)((long)&gw[2].resize + 4) <= *(int *)&gw[2].draw)
        goto LAB_0010cc16;
        iVar13 = *(int *)&gw[2].draw + 1;
      }
      else if (wVar7 == L'ă') {
        if (*(int *)&gw[2].draw < 1) goto LAB_0010cc16;
        iVar13 = *(int *)&gw[2].draw + -1;
      }
      else {
        iVar13 = 0;
        if (wVar7 != L'Ć') goto LAB_0010ce6b;
      }
LAB_0010cda8:
      *(int *)&gw[2].draw = iVar13;
      goto LAB_0010cc16;
    }
    if (wVar7 < L'ŗ') {
      if (wVar7 == L'Œ') goto LAB_0010cd55;
      if (wVar7 == L'œ') goto LAB_0010cd15;
    }
    else {
      if (wVar7 == L'Ũ') {
LAB_0010cd94:
        iVar13 = *(int *)&gw[1].prev;
        goto LAB_0010cd99;
      }
      if (wVar7 == L'ŗ') goto LAB_0010cf9c;
    }
  }
LAB_0010ce6b:
  wVar1 = *(wchar_t *)&gw[1].prev;
  wVar2 = *(wchar_t *)&gw[2].draw;
  wVar3 = *(wchar_t *)((long)&gw[2].resize + 4);
  wVar18 = wVar3 + wVar2;
  if (wVar1 < wVar3 + wVar2) {
    wVar18 = wVar1;
  }
  if (wVar2 < wVar18) {
    p_Var9 = gw[1].resize + (long)wVar2 * 0x10c + 0x108;
    wVar20 = wVar2;
    do {
      if (wVar7 == (char)*p_Var9) goto LAB_0010cf43;
      wVar20 = wVar20 + L'\x01';
      p_Var9 = p_Var9 + 0x10c;
    } while (wVar18 != wVar20);
    p_Var9 = gw[1].resize + (long)wVar2 * 0x10c + 0x109;
    wVar20 = wVar2;
    do {
      if (wVar7 == (char)*p_Var9) goto LAB_0010cf43;
      wVar20 = wVar20 + L'\x01';
      p_Var9 = p_Var9 + 0x10c;
    } while (wVar18 != wVar20);
  }
  if (L'\0' < wVar1 && wVar3 < wVar1) {
    pcVar19 = gw[1].resize + 0x108;
    lVar14 = 0;
LAB_0010cf0d:
    if (wVar7 != (char)*pcVar19) goto code_r0x0010cf16;
    iVar13 = (int)lVar14;
    wVar20 = -iVar13;
    wVar7 = L'\x01' - (wVar3 + iVar13);
    if (SBORROW4(wVar2,wVar20) == wVar2 + iVar13 < 0) {
      wVar7 = wVar20;
    }
    *(wchar_t *)&gw[2].draw = wVar7;
LAB_0010cf43:
    if ((wVar20 != L'\xffffffff') &&
       ((changefn == (_func_nh_bool_win_menu_ptr_wchar_t *)0x0 ||
        (nVar4 = (*changefn)((win_menu *)(gw + 1),wVar20), nVar4 != '\0')))) {
      *(bool *)((long)((gw[1].win)->_bkgrnd).chars + (long)wVar20 + -0x5c) =
           *(char *)((long)((gw[1].win)->_bkgrnd).chars + (long)wVar20 + -0x5c) == '\0';
      uVar17 = *(int *)((long)&gw[1].prev + 4) - 1;
      goto LAB_0010cd79;
    }
  }
  goto LAB_0010cc16;
code_r0x0010cf16:
  lVar14 = lVar14 + -1;
  pcVar19 = pcVar19 + 0x10c;
  if (-lVar14 == (ulong)(uint)wVar1) goto LAB_0010cc16;
  goto LAB_0010cf0d;
}

Assistant:

int curses_display_menu_core(struct nh_menuitem *items, int icount,
			     const char *title, int how, int *results,
			     int x1, int y1, int x2, int y2,
			     nh_bool (*changefn)(struct win_menu*, int),
			     nh_bool start_at_bottom)
{
    struct gamewin *gw;
    struct win_menu *mdat;
    int i, key, idx, rv, startx, starty, prevcurs, prev_offset;
    nh_bool done, cancelled;
    char sbuf[BUFSZ];
    
    prevcurs = curs_set(0);
    
    gw = alloc_gamewin(sizeof(struct win_menu));
    gw->draw = draw_menu;
    gw->resize = resize_menu;
    mdat = (struct win_menu*)gw->extra;
    mdat->items = items;
    mdat->icount = icount;
    mdat->title = title;
    mdat->how = how;
    mdat->selected = calloc(icount, sizeof(nh_bool));
    mdat->x1 = x1; mdat->y1 = y1; mdat->x2 = x2; mdat->y2 = y2;
    
    if (x1 < 0) x1 = 0;
    if (y1 < 0) y1 = 0;
    if (x2 < 0) x2 = COLS;
    if (y2 < 0) y2 = LINES;
    
    assign_menu_accelerators(mdat);
    layout_menu(gw);

    if (start_at_bottom)
	mdat->offset = max(mdat->icount - mdat->innerheight, 0);

    starty = (y2 - y1 - mdat->height) / 2 + y1;
    startx = (x2 - x1 - mdat->width) / 2 + x1;
    
    gw->win = newwin(mdat->height, mdat->width, starty, startx);
    keypad(gw->win, TRUE);
    nh_box_wborder(gw->win, FRAME_ATTRS);
    mdat->content = derwin(gw->win, mdat->innerheight, mdat->innerwidth,
			   mdat->frameheight-1, 2);
    leaveok(gw->win, TRUE);
    leaveok(mdat->content, TRUE);
    done = FALSE;
    cancelled = FALSE;
    while (!done && !cancelled) {
	draw_menu(gw);
	
	key = nh_wgetch(gw->win);
	
	switch (key) {
	    /* one line up */
	    case KEY_UP:
		if (mdat->offset > 0)
		    mdat->offset--;
		break;
		
	    /* one line down */
	    case KEY_DOWN:
		if (mdat->offset < mdat->icount - mdat->innerheight)
		    mdat->offset++;
		break;
	    
	    /* page up */
	    case KEY_PPAGE:
	    case '<':
		mdat->offset -= mdat->innerheight;
		if (mdat->offset < 0)
		    mdat->offset = 0;
		break;
	    
	    /* page down */
	    case KEY_NPAGE:
	    case '>':
	    case ' ':
		prev_offset = mdat->offset;
		mdat->offset += mdat->innerheight;
		if (mdat->offset > mdat->icount - mdat->innerheight)
		    mdat->offset = mdat->icount - mdat->innerheight;
		if (key == ' ' && mdat->offset == prev_offset)
		    done = TRUE;
		break;
		
	    /* go to the top */
	    case KEY_HOME:
	    case '^':
		mdat->offset = 0;
		break;
		
	    /* go to the end */
	    case KEY_END:
	    case '|':
		mdat->offset = max(mdat->icount - mdat->innerheight, 0);
		break;
		
	    /* cancel */
	    case KEY_ESC:
		cancelled = TRUE;
		break;
		
	    /* confirm */
	    case KEY_ENTER:
	    case '\r':
		done = TRUE;
		break;
		
	    /* select all */
	    case '.':
		if (mdat->how == PICK_ANY)
		    for (i = 0; i < icount; i++)
			if (mdat->items[i].role == MI_NORMAL)
			    mdat->selected[i] = TRUE;
		break;
		
	    /* select none */
	    case '-':
		for (i = 0; i < icount; i++)
		    mdat->selected[i] = FALSE;
		break;
		
	    /* search for a menu item */
	    case ':':
		curses_getline("Search:", sbuf);
		for (i = 0; i < icount; i++)
		    if (strstr(mdat->items[i].caption, sbuf))
			break;
		if (i < icount) {
		    int end = max(mdat->icount - mdat->innerheight, 0);
		    mdat->offset = min(i, end);
		}
		break;
		
	    /* try to find an item for this key and, if one is found, select it */
	    default:
		idx = find_accel(key, mdat);
		
		if (idx != -1 && /* valid accelerator */
		    (!changefn || changefn(mdat, idx))) {
		    mdat->selected[idx] = !mdat->selected[idx];
		    
		    if (mdat->how == PICK_ONE)
			done = TRUE;
		}
		break;
	}
    }
    
    delwin(mdat->content);
    delwin(gw->win);
    
    if (cancelled)
	rv = -1;
    else {
	rv = 0;
	for (i = 0; i < icount; i++) {
	    if (mdat->selected[i]) {
		if (results)
		    results[rv] = items[i].id;
		rv++;
	    }
	}
    }
    
    free(mdat->selected);
    delete_gamewin(gw);    
    redraw_game_windows();
    curs_set(prevcurs);
	
    return rv;
}